

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::TextureSpecificationTests::init
          (TextureSpecificationTests *this,EVP_PKEY_CTX *ctx)

{
  TextureFormat TVar1;
  deUint32 dVar2;
  int iVar3;
  int iVar4;
  int numLevels;
  char *pcVar5;
  Context *pCVar6;
  _Alloc_hider _Var7;
  TestNode *pTVar8;
  TextureCubeArraySpecCase *pTVar9;
  long *plVar10;
  TestNode *pTVar11;
  undefined8 *puVar12;
  TextureFormat *pTVar13;
  size_type *psVar14;
  ulong *puVar15;
  ulong uVar16;
  long lVar17;
  string name;
  TextureFormat local_370;
  TextureFormat local_368;
  long local_360;
  TextureFormat TStack_358;
  long *local_350;
  undefined8 local_348;
  long local_340;
  undefined8 uStack_338;
  Context *local_330;
  ulong *local_328;
  long local_320;
  ulong local_318;
  long lStack_310;
  long *local_308;
  undefined8 local_300;
  long local_2f8;
  undefined8 uStack_2f0;
  ulong *local_2e8;
  long local_2e0;
  ulong local_2d8;
  long lStack_2d0;
  ulong *local_2c8;
  long local_2c0;
  ulong local_2b8;
  long lStack_2b0;
  undefined4 local_2a4;
  long *local_2a0;
  undefined8 local_298;
  long local_290;
  undefined8 uStack_288;
  string fmtName;
  ios_base local_210 [264];
  ulong *local_108;
  long local_100;
  ulong local_f8 [2];
  ulong *local_e8;
  long local_e0;
  ulong local_d8 [2];
  ulong *local_c8;
  long local_c0;
  ulong local_b8 [2];
  ulong *local_a8;
  long local_a0;
  ulong local_98 [2];
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  size_type local_68;
  undefined8 uStack_60;
  pointer local_58;
  size_type sStack_50;
  _func_int **local_48;
  TestContext *pTStack_40;
  
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "basic_teximage3d","Basic glTexImage3D() usage");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar17 = 8;
  do {
    pcVar5 = *(char **)(&UNK_02166bd8 + lVar17);
    dVar2 = *(deUint32 *)((long)&PTR_anon_var_dwarf_4d3a45_02166be0 + lVar17);
    pTVar9 = (TextureCubeArraySpecCase *)operator_new(0xd8);
    pCVar6 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,pcVar5,(allocator<char> *)&local_328);
    plVar10 = (long *)std::__cxx11::string::append((char *)&name);
    psVar14 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar14) {
      fmtName.field_2._M_allocated_capacity = *psVar14;
      fmtName.field_2._8_8_ = plVar10[3];
      fmtName._M_dataplus._M_p = (pointer)&fmtName.field_2;
    }
    else {
      fmtName.field_2._M_allocated_capacity = *psVar14;
      fmtName._M_dataplus._M_p = (pointer)*plVar10;
    }
    _Var7._M_p = fmtName._M_dataplus._M_p;
    fmtName._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    local_370 = glu::mapGLInternalFormat(dVar2);
    TextureCubeArraySpecCase::TextureCubeArraySpecCase
              (pTVar9,pCVar6,_Var7._M_p,::glcts::fixed_sample_locations_values + 1,&local_370,0x40,6
               ,7);
    (pTVar9->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TextureCubeArraySpecCase_021672b8;
    *(deUint32 *)&pTVar9->field_0xd4 = dVar2;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fmtName._M_dataplus._M_p != &fmtName.field_2) {
      operator_delete(fmtName._M_dataplus._M_p,fmtName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    lVar17 = lVar17 + 0x10;
  } while (lVar17 != 0x318);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "teximage3d_pbo","glTexImage3D() from PBO");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar17 = 8;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fmtName,*(char **)(&UNK_02166bd8 + lVar17),(allocator<char> *)&name);
    dVar2 = *(deUint32 *)((long)&PTR_anon_var_dwarf_4d3a45_02166be0 + lVar17);
    pTVar9 = (TextureCubeArraySpecCase *)operator_new(0xf8);
    pCVar6 = (this->super_TestCaseGroup).m_context;
    name._M_dataplus._M_p = (pointer)&name.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&name,fmtName._M_dataplus._M_p,
               fmtName._M_dataplus._M_p + fmtName._M_string_length);
    std::__cxx11::string::append((char *)&name);
    _Var7 = name._M_dataplus;
    local_370 = glu::mapGLInternalFormat(dVar2);
    TextureCubeArraySpecCase::TextureCubeArraySpecCase
              (pTVar9,pCVar6,_Var7._M_p,::glcts::fixed_sample_locations_values + 1,&local_370,0x14,6
               ,1);
    (pTVar9->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TextureCubeArraySpecCase_02167320;
    *(deUint32 *)&pTVar9->field_0xd4 = dVar2;
    pTVar9[1].super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)0x0;
    pTVar9[1].super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx =
         (TestContext *)0x0;
    *(undefined4 *)
     &pTVar9[1].super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode.m_name.
      _M_dataplus._M_p = 0;
    *(undefined8 *)
     ((long)&pTVar9[1].super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode.m_name.
             _M_dataplus._M_p + 4) = 4;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fmtName._M_dataplus._M_p != &fmtName.field_2) {
      operator_delete(fmtName._M_dataplus._M_p,fmtName.field_2._M_allocated_capacity + 1);
    }
    lVar17 = lVar17 + 0x10;
  } while (lVar17 != 0x318);
  lVar17 = 0;
  do {
    pTVar9 = (TextureCubeArraySpecCase *)operator_new(0xf8);
    pCVar6 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,*(char **)((long)&init::parameterCases[0].name + lVar17),
               (allocator<char> *)&local_328);
    plVar10 = (long *)std::__cxx11::string::append((char *)&name);
    psVar14 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar14) {
      fmtName.field_2._M_allocated_capacity = *psVar14;
      fmtName.field_2._8_8_ = plVar10[3];
      fmtName._M_dataplus._M_p = (pointer)&fmtName.field_2;
    }
    else {
      fmtName.field_2._M_allocated_capacity = *psVar14;
      fmtName._M_dataplus._M_p = (pointer)*plVar10;
    }
    _Var7._M_p = fmtName._M_dataplus._M_p;
    fmtName._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    dVar2 = *(deUint32 *)((long)&init::parameterCases[0].format + lVar17);
    iVar3 = *(int *)((long)&init::parameterCases[0].size + lVar17);
    iVar4 = *(int *)((long)&init::parameterCases[0].depth + lVar17);
    local_48 = *(_func_int ***)((long)&init::parameterCases[0].imageHeight + lVar17);
    pTStack_40 = *(TestContext **)((long)&init::parameterCases[0].skipImages + lVar17);
    local_58 = *(pointer *)((long)&init::parameterCases[0].skipPixels + lVar17);
    sStack_50 = 0;
    local_68 = CONCAT44(local_68._4_4_,
                        *(undefined4 *)((long)&init::parameterCases[0].offset + lVar17));
    local_330 = pCVar6;
    local_370 = glu::mapGLInternalFormat(dVar2);
    TextureCubeArraySpecCase::TextureCubeArraySpecCase
              (pTVar9,local_330,_Var7._M_p,::glcts::fixed_sample_locations_values + 1,&local_370,
               iVar3,iVar4,1);
    (pTVar9->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TextureCubeArraySpecCase_02167320;
    *(deUint32 *)&pTVar9->field_0xd4 = dVar2;
    pTVar9[1].super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         local_48;
    pTVar9[1].super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx =
         pTStack_40;
    pTVar9[1].super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus.
    _M_p = local_58;
    *(undefined4 *)
     &pTVar9[1].super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode.m_name.
      _M_string_length = (undefined4)local_68;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fmtName._M_dataplus._M_p != &fmtName.field_2) {
      operator_delete(fmtName._M_dataplus._M_p,fmtName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    lVar17 = lVar17 + 0x30;
  } while (lVar17 != 0x150);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "teximage3d_depth","glTexImage3D() with depth or depth/stencil format");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar17 = 8;
  do {
    pTVar11 = (TestNode *)operator_new(0xd8);
    pCVar6 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,*(char **)(&UNK_02166ee8 + lVar17),(allocator<char> *)&local_370);
    plVar10 = (long *)std::__cxx11::string::append((char *)&name);
    fmtName._M_dataplus._M_p = (pointer)&fmtName.field_2;
    psVar14 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar14) {
      fmtName.field_2._M_allocated_capacity = *psVar14;
      fmtName.field_2._8_8_ = plVar10[3];
    }
    else {
      fmtName.field_2._M_allocated_capacity = *psVar14;
      fmtName._M_dataplus._M_p = (pointer)*plVar10;
    }
    fmtName._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    TexImageCubeArrayDepthCase::TexImageCubeArrayDepthCase
              ((TexImageCubeArrayDepthCase *)pTVar11,pCVar6,fmtName._M_dataplus._M_p,
               ::glcts::fixed_sample_locations_values + 1,
               *(deUint32 *)((long)&init::depthStencilFormats[0].name + lVar17),0x40,6);
    tcu::TestNode::addChild(pTVar8,pTVar11);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fmtName._M_dataplus._M_p != &fmtName.field_2) {
      operator_delete(fmtName._M_dataplus._M_p,fmtName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    lVar17 = lVar17 + 0x10;
  } while (lVar17 != 0x58);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "teximage3d_depth_pbo","glTexImage3D() with depth or depth/stencil format with pbo");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar17 = 8;
  do {
    pTVar11 = (TestNode *)operator_new(0xd8);
    pCVar6 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,*(char **)(&UNK_02166ee8 + lVar17),(allocator<char> *)&local_370);
    plVar10 = (long *)std::__cxx11::string::append((char *)&name);
    fmtName._M_dataplus._M_p = (pointer)&fmtName.field_2;
    psVar14 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar14) {
      fmtName.field_2._M_allocated_capacity = *psVar14;
      fmtName.field_2._8_8_ = plVar10[3];
    }
    else {
      fmtName.field_2._M_allocated_capacity = *psVar14;
      fmtName._M_dataplus._M_p = (pointer)*plVar10;
    }
    fmtName._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    TexImageCubeArrayDepthBufferCase::TexImageCubeArrayDepthBufferCase
              ((TexImageCubeArrayDepthBufferCase *)pTVar11,pCVar6,fmtName._M_dataplus._M_p,
               ::glcts::fixed_sample_locations_values + 1,
               *(deUint32 *)((long)&init::depthStencilFormats[0].name + lVar17),0x40,6);
    tcu::TestNode::addChild(pTVar8,pTVar11);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fmtName._M_dataplus._M_p != &fmtName.field_2) {
      operator_delete(fmtName._M_dataplus._M_p,fmtName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    lVar17 = lVar17 + 0x10;
  } while (lVar17 != 0x58);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "texsubimage3d_pbo","glTexSubImage3D() pixel buffer object tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar17 = 8;
  do {
    pTVar9 = (TextureCubeArraySpecCase *)operator_new(0x110);
    pCVar6 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,*(char **)(&UNK_02166bd8 + lVar17),(allocator<char> *)&local_328);
    plVar10 = (long *)std::__cxx11::string::append((char *)&name);
    psVar14 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar14) {
      fmtName.field_2._M_allocated_capacity = *psVar14;
      fmtName.field_2._8_8_ = plVar10[3];
      fmtName._M_dataplus._M_p = (pointer)&fmtName.field_2;
    }
    else {
      fmtName.field_2._M_allocated_capacity = *psVar14;
      fmtName._M_dataplus._M_p = (pointer)*plVar10;
    }
    _Var7._M_p = fmtName._M_dataplus._M_p;
    fmtName._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    dVar2 = *(deUint32 *)((long)&PTR_anon_var_dwarf_4d3a45_02166be0 + lVar17);
    local_370 = glu::mapGLInternalFormat(dVar2);
    TextureCubeArraySpecCase::TextureCubeArraySpecCase
              (pTVar9,pCVar6,_Var7._M_p,::glcts::fixed_sample_locations_values + 1,&local_370,0x1a,
               0xc,1);
    (pTVar9->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TextureCubeArraySpecCase_02167458;
    *(deUint32 *)&pTVar9->field_0xd4 = dVar2;
    pTVar9[1].super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)0x200000001;
    pTVar9[1].super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx =
         (TestContext *)0x1700000000;
    pTVar9[1].super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus.
    _M_p = (pointer)0x800000013;
    pTVar9[1].super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode.m_name.
    _M_string_length = 0;
    pTVar9[1].super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode.m_name.field_2.
    _M_allocated_capacity = 0;
    *(undefined4 *)
     ((long)&pTVar9[1].super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode.m_name.
             field_2 + 8) = 0;
    *(undefined8 *)
     ((long)&pTVar9[1].super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode.m_name.
             field_2 + 0xc) = 4;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fmtName._M_dataplus._M_p != &fmtName.field_2) {
      operator_delete(fmtName._M_dataplus._M_p,fmtName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    lVar17 = lVar17 + 0x10;
  } while (lVar17 != 0x318);
  lVar17 = 0;
  do {
    pTVar9 = (TextureCubeArraySpecCase *)operator_new(0x110);
    pCVar6 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,*(char **)((long)&init::paramCases[0].name + lVar17),
               (allocator<char> *)&local_328);
    plVar10 = (long *)std::__cxx11::string::append((char *)&name);
    psVar14 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar14) {
      fmtName.field_2._M_allocated_capacity = *psVar14;
      fmtName.field_2._8_8_ = plVar10[3];
      fmtName._M_dataplus._M_p = (pointer)&fmtName.field_2;
    }
    else {
      fmtName.field_2._M_allocated_capacity = *psVar14;
      fmtName._M_dataplus._M_p = (pointer)*plVar10;
    }
    _Var7._M_p = fmtName._M_dataplus._M_p;
    fmtName._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    dVar2 = *(deUint32 *)((long)&init::paramCases[0].format + lVar17);
    iVar3 = *(int *)((long)&init::paramCases[0].size + lVar17);
    iVar4 = *(int *)((long)&init::paramCases[0].depth + lVar17);
    local_48 = *(_func_int ***)((long)&init::paramCases[0].subX + lVar17);
    pTStack_40 = *(TestContext **)((long)&init::paramCases[0].subZ + lVar17);
    local_58 = *(pointer *)((long)&init::paramCases[0].subH + lVar17);
    sStack_50 = *(size_type *)((long)&init::paramCases[0].imageHeight + lVar17);
    local_68 = *(size_type *)((long)&init::paramCases[0].skipImages + lVar17);
    uStack_60 = *(undefined8 *)((long)&init::paramCases[0].skipPixels + lVar17);
    local_2a4 = *(undefined4 *)((long)&init::paramCases[0].offset + lVar17);
    local_330 = pCVar6;
    local_370 = glu::mapGLInternalFormat(dVar2);
    TextureCubeArraySpecCase::TextureCubeArraySpecCase
              (pTVar9,local_330,_Var7._M_p,::glcts::fixed_sample_locations_values + 1,&local_370,
               iVar3,iVar4,1);
    (pTVar9->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TextureCubeArraySpecCase_02167458;
    *(deUint32 *)&pTVar9->field_0xd4 = dVar2;
    pTVar9[1].super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         local_48;
    pTVar9[1].super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode.m_testCtx =
         pTStack_40;
    pTVar9[1].super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus.
    _M_p = local_58;
    pTVar9[1].super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode.m_name.
    _M_string_length = sStack_50;
    pTVar9[1].super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode.m_name.field_2.
    _M_allocated_capacity = local_68;
    *(undefined8 *)
     ((long)&pTVar9[1].super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode.m_name.
             field_2 + 8) = uStack_60;
    *(undefined4 *)
     &pTVar9[1].super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode.m_description.
      _M_dataplus._M_p = local_2a4;
    tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fmtName._M_dataplus._M_p != &fmtName.field_2) {
      operator_delete(fmtName._M_dataplus._M_p,fmtName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    lVar17 = lVar17 + 0x48;
  } while (lVar17 != 0x1b0);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "texsubimage3d_depth","glTexSubImage3D() with depth or depth/stencil format");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  lVar17 = 8;
  do {
    pTVar11 = (TestNode *)operator_new(0xd8);
    pCVar6 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,*(char **)(&UNK_02166ee8 + lVar17),(allocator<char> *)&local_370);
    plVar10 = (long *)std::__cxx11::string::append((char *)&name);
    fmtName._M_dataplus._M_p = (pointer)&fmtName.field_2;
    psVar14 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar14) {
      fmtName.field_2._M_allocated_capacity = *psVar14;
      fmtName.field_2._8_8_ = plVar10[3];
    }
    else {
      fmtName.field_2._M_allocated_capacity = *psVar14;
      fmtName._M_dataplus._M_p = (pointer)*plVar10;
    }
    fmtName._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    TexSubImageCubeArrayDepthCase::TexSubImageCubeArrayDepthCase
              ((TexSubImageCubeArrayDepthCase *)pTVar11,pCVar6,fmtName._M_dataplus._M_p,
               ::glcts::fixed_sample_locations_values + 1,
               *(deUint32 *)((long)&init::depthStencilFormats[0].name + lVar17),0x39,6);
    tcu::TestNode::addChild(pTVar8,pTVar11);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fmtName._M_dataplus._M_p != &fmtName.field_2) {
      operator_delete(fmtName._M_dataplus._M_p,fmtName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    lVar17 = lVar17 + 0x10;
  } while (lVar17 != 0x58);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"texstorage3d"
             ,"Basic glTexStorage3D() usage");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"format",
             "glTexStorage3D() with all formats");
  tcu::TestNode::addChild(pTVar8,pTVar11);
  lVar17 = 8;
  do {
    pcVar5 = *(char **)(&UNK_02166bd8 + lVar17);
    dVar2 = *(deUint32 *)((long)&PTR_anon_var_dwarf_4d3a45_02166be0 + lVar17);
    pTVar9 = (TextureCubeArraySpecCase *)operator_new(0xd8);
    pCVar6 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,pcVar5,(allocator<char> *)&local_328);
    plVar10 = (long *)std::__cxx11::string::append((char *)&name);
    fmtName._M_dataplus._M_p = (pointer)&fmtName.field_2;
    psVar14 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar14) {
      fmtName.field_2._M_allocated_capacity = *psVar14;
      fmtName.field_2._8_8_ = plVar10[3];
    }
    else {
      fmtName.field_2._M_allocated_capacity = *psVar14;
      fmtName._M_dataplus._M_p = (pointer)*plVar10;
    }
    _Var7._M_p = fmtName._M_dataplus._M_p;
    fmtName._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    local_370 = glu::mapGLInternalFormat(dVar2);
    TextureCubeArraySpecCase::TextureCubeArraySpecCase
              (pTVar9,pCVar6,_Var7._M_p,::glcts::fixed_sample_locations_values + 1,&local_370,0x39,6
               ,6);
    (pTVar9->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TextureCubeArraySpecCase_02167528;
    *(deUint32 *)&pTVar9->field_0xd4 = dVar2;
    tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fmtName._M_dataplus._M_p != &fmtName.field_2) {
      operator_delete(fmtName._M_dataplus._M_p,fmtName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    lVar17 = lVar17 + 0x10;
  } while (lVar17 != 0x318);
  lVar17 = 8;
  do {
    pcVar5 = *(char **)(&UNK_02166ee8 + lVar17);
    dVar2 = *(deUint32 *)((long)&init::depthStencilFormats[0].name + lVar17);
    pTVar9 = (TextureCubeArraySpecCase *)operator_new(0xd8);
    pCVar6 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,pcVar5,(allocator<char> *)&local_328);
    plVar10 = (long *)std::__cxx11::string::append((char *)&name);
    fmtName._M_dataplus._M_p = (pointer)&fmtName.field_2;
    psVar14 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar14) {
      fmtName.field_2._M_allocated_capacity = *psVar14;
      fmtName.field_2._8_8_ = plVar10[3];
    }
    else {
      fmtName.field_2._M_allocated_capacity = *psVar14;
      fmtName._M_dataplus._M_p = (pointer)*plVar10;
    }
    _Var7._M_p = fmtName._M_dataplus._M_p;
    fmtName._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    local_370 = glu::mapGLInternalFormat(dVar2);
    TextureCubeArraySpecCase::TextureCubeArraySpecCase
              (pTVar9,pCVar6,_Var7._M_p,::glcts::fixed_sample_locations_values + 1,&local_370,0x39,6
               ,6);
    (pTVar9->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TextureCubeArraySpecCase_02167528;
    *(deUint32 *)&pTVar9->field_0xd4 = dVar2;
    tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fmtName._M_dataplus._M_p != &fmtName.field_2) {
      operator_delete(fmtName._M_dataplus._M_p,fmtName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    lVar17 = lVar17 + 0x10;
  } while (lVar17 != 0x58);
  pTVar11 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar11,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"size",
             "glTexStorage3D() with various sizes");
  tcu::TestNode::addChild(pTVar8,pTVar11);
  local_330 = (Context *)0x8;
  do {
    iVar3 = *(int *)("cube_array_" + (long)local_330 + 8);
    iVar4 = *(int *)(&UNK_01c6389c + (long)local_330);
    numLevels = *(int *)((long)&init::texCubeArraySizes[0].size + (long)local_330);
    local_88 = local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"cube_array_","");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&fmtName);
    std::ostream::operator<<(&fmtName,iVar3);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fmtName);
    std::ios_base::~ios_base(local_210);
    uVar16 = 0xf;
    if (local_88 != local_78) {
      uVar16 = local_78[0];
    }
    if (uVar16 < (ulong)(local_a0 + local_80)) {
      uVar16 = 0xf;
      if (local_a8 != local_98) {
        uVar16 = local_98[0];
      }
      if (uVar16 < (ulong)(local_a0 + local_80)) goto LAB_014e9ee9;
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_88);
    }
    else {
LAB_014e9ee9:
      puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_a8);
    }
    plVar10 = puVar12 + 2;
    if ((long *)*puVar12 == plVar10) {
      local_290 = *plVar10;
      uStack_288 = puVar12[3];
      local_2a0 = &local_290;
    }
    else {
      local_290 = *plVar10;
      local_2a0 = (long *)*puVar12;
    }
    local_298 = puVar12[1];
    *puVar12 = plVar10;
    puVar12[1] = 0;
    *(undefined1 *)plVar10 = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_2a0);
    local_2e8 = &local_2d8;
    puVar15 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar15) {
      local_2d8 = *puVar15;
      lStack_2d0 = plVar10[3];
    }
    else {
      local_2d8 = *puVar15;
      local_2e8 = (ulong *)*plVar10;
    }
    local_2e0 = plVar10[1];
    *plVar10 = (long)puVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&fmtName);
    std::ostream::operator<<(&fmtName,iVar3);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fmtName);
    std::ios_base::~ios_base(local_210);
    uVar16 = 0xf;
    if (local_2e8 != &local_2d8) {
      uVar16 = local_2d8;
    }
    if (uVar16 < (ulong)(local_c0 + local_2e0)) {
      uVar16 = 0xf;
      if (local_c8 != local_b8) {
        uVar16 = local_b8[0];
      }
      if (uVar16 < (ulong)(local_c0 + local_2e0)) goto LAB_014ea076;
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_2e8);
    }
    else {
LAB_014ea076:
      puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_c8);
    }
    local_350 = &local_340;
    plVar10 = puVar12 + 2;
    if ((long *)*puVar12 == plVar10) {
      local_340 = *plVar10;
      uStack_338 = puVar12[3];
    }
    else {
      local_340 = *plVar10;
      local_350 = (long *)*puVar12;
    }
    local_348 = puVar12[1];
    *puVar12 = plVar10;
    puVar12[1] = 0;
    *(undefined1 *)plVar10 = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_350);
    local_2c8 = &local_2b8;
    puVar15 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar15) {
      local_2b8 = *puVar15;
      lStack_2b0 = plVar10[3];
    }
    else {
      local_2b8 = *puVar15;
      local_2c8 = (ulong *)*plVar10;
    }
    local_2c0 = plVar10[1];
    *plVar10 = (long)puVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&fmtName);
    std::ostream::operator<<(&fmtName,iVar4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fmtName);
    std::ios_base::~ios_base(local_210);
    uVar16 = 0xf;
    if (local_2c8 != &local_2b8) {
      uVar16 = local_2b8;
    }
    if (uVar16 < (ulong)(local_e0 + local_2c0)) {
      uVar16 = 0xf;
      if (local_e8 != local_d8) {
        uVar16 = local_d8[0];
      }
      if (uVar16 < (ulong)(local_e0 + local_2c0)) goto LAB_014ea1f9;
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_2c8);
    }
    else {
LAB_014ea1f9:
      puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_e8);
    }
    local_308 = &local_2f8;
    plVar10 = puVar12 + 2;
    if ((long *)*puVar12 == plVar10) {
      local_2f8 = *plVar10;
      uStack_2f0 = puVar12[3];
    }
    else {
      local_2f8 = *plVar10;
      local_308 = (long *)*puVar12;
    }
    local_300 = puVar12[1];
    *puVar12 = plVar10;
    puVar12[1] = 0;
    *(undefined1 *)plVar10 = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_308);
    local_328 = &local_318;
    puVar15 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar15) {
      local_318 = *puVar15;
      lStack_310 = plVar10[3];
    }
    else {
      local_318 = *puVar15;
      local_328 = (ulong *)*plVar10;
    }
    local_320 = plVar10[1];
    *plVar10 = (long)puVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&fmtName);
    std::ostream::operator<<(&fmtName,numLevels);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fmtName);
    std::ios_base::~ios_base(local_210);
    uVar16 = 0xf;
    if (local_328 != &local_318) {
      uVar16 = local_318;
    }
    if (uVar16 < (ulong)(local_100 + local_320)) {
      uVar16 = 0xf;
      if (local_108 != local_f8) {
        uVar16 = local_f8[0];
      }
      if (uVar16 < (ulong)(local_100 + local_320)) goto LAB_014ea38e;
      pTVar13 = (TextureFormat *)
                std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,(ulong)local_328);
    }
    else {
LAB_014ea38e:
      pTVar13 = (TextureFormat *)
                std::__cxx11::string::_M_append((char *)&local_328,(ulong)local_108);
    }
    TVar1 = (TextureFormat)(pTVar13 + 2);
    if (*pTVar13 == TVar1) {
      local_360 = *(long *)TVar1;
      TStack_358 = pTVar13[3];
      local_370 = (TextureFormat)&local_360;
    }
    else {
      local_360 = *(long *)TVar1;
      local_370 = *pTVar13;
    }
    local_368 = pTVar13[1];
    *pTVar13 = TVar1;
    pTVar13[1].order = R;
    pTVar13[1].type = SNORM_INT8;
    *(undefined1 *)TVar1 = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_370);
    name._M_dataplus._M_p = (pointer)&name.field_2;
    psVar14 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar14) {
      name.field_2._M_allocated_capacity = *psVar14;
      name.field_2._8_8_ = plVar10[3];
    }
    else {
      name.field_2._M_allocated_capacity = *psVar14;
      name._M_dataplus._M_p = (pointer)*plVar10;
    }
    name._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if (local_370 != (TextureFormat)&local_360) {
      operator_delete((void *)local_370,local_360 + 1);
    }
    if (local_108 != local_f8) {
      operator_delete(local_108,local_f8[0] + 1);
    }
    if (local_328 != &local_318) {
      operator_delete(local_328,local_318 + 1);
    }
    if (local_308 != &local_2f8) {
      operator_delete(local_308,local_2f8 + 1);
    }
    if (local_e8 != local_d8) {
      operator_delete(local_e8,local_d8[0] + 1);
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if (local_350 != &local_340) {
      operator_delete(local_350,local_340 + 1);
    }
    if (local_c8 != local_b8) {
      operator_delete(local_c8,local_b8[0] + 1);
    }
    if (local_2e8 != &local_2d8) {
      operator_delete(local_2e8,local_2d8 + 1);
    }
    if (local_2a0 != &local_290) {
      operator_delete(local_2a0,local_290 + 1);
    }
    if (local_a8 != local_98) {
      operator_delete(local_a8,local_98[0] + 1);
    }
    if (local_88 != local_78) {
      operator_delete(local_88,local_78[0] + 1);
    }
    pTVar9 = (TextureCubeArraySpecCase *)operator_new(0xd8);
    _Var7 = name._M_dataplus;
    pCVar6 = (this->super_TestCaseGroup).m_context;
    fmtName._M_dataplus._M_p = (pointer)glu::mapGLInternalFormat(0x8058);
    TextureCubeArraySpecCase::TextureCubeArraySpecCase
              (pTVar9,pCVar6,_Var7._M_p,::glcts::fixed_sample_locations_values + 1,
               (TextureFormat *)&fmtName,iVar3,iVar4,numLevels);
    (pTVar9->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TextureCubeArraySpecCase_02167528;
    *(undefined4 *)&pTVar9->field_0xd4 = 0x8058;
    tcu::TestNode::addChild(pTVar11,(TestNode *)pTVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)name._M_dataplus._M_p != &name.field_2) {
      operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
    }
    local_330 = (Context *)((long)local_330 + 0xc);
    if (local_330 == (Context *)0x5c) {
      return 0x5c;
    }
  } while( true );
}

Assistant:

void TextureSpecificationTests::init (void)
{
	struct
	{
		const char*	name;
		deUint32	internalFormat;
	} colorFormats[] =
	{
		{ "rgba32f",			GL_RGBA32F,			},
		{ "rgba32i",			GL_RGBA32I,			},
		{ "rgba32ui",			GL_RGBA32UI,		},
		{ "rgba16f",			GL_RGBA16F,			},
		{ "rgba16i",			GL_RGBA16I,			},
		{ "rgba16ui",			GL_RGBA16UI,		},
		{ "rgba8",				GL_RGBA8,			},
		{ "rgba8i",				GL_RGBA8I,			},
		{ "rgba8ui",			GL_RGBA8UI,			},
		{ "srgb8_alpha8",		GL_SRGB8_ALPHA8,	},
		{ "rgb10_a2",			GL_RGB10_A2,		},
		{ "rgb10_a2ui",			GL_RGB10_A2UI,		},
		{ "rgba4",				GL_RGBA4,			},
		{ "rgb5_a1",			GL_RGB5_A1,			},
		{ "rgba8_snorm",		GL_RGBA8_SNORM,		},
		{ "rgb8",				GL_RGB8,			},
		{ "rgb565",				GL_RGB565,			},
		{ "r11f_g11f_b10f",		GL_R11F_G11F_B10F,	},
		{ "rgb32f",				GL_RGB32F,			},
		{ "rgb32i",				GL_RGB32I,			},
		{ "rgb32ui",			GL_RGB32UI,			},
		{ "rgb16f",				GL_RGB16F,			},
		{ "rgb16i",				GL_RGB16I,			},
		{ "rgb16ui",			GL_RGB16UI,			},
		{ "rgb8_snorm",			GL_RGB8_SNORM,		},
		{ "rgb8i",				GL_RGB8I,			},
		{ "rgb8ui",				GL_RGB8UI,			},
		{ "srgb8",				GL_SRGB8,			},
		{ "rgb9_e5",			GL_RGB9_E5,			},
		{ "rg32f",				GL_RG32F,			},
		{ "rg32i",				GL_RG32I,			},
		{ "rg32ui",				GL_RG32UI,			},
		{ "rg16f",				GL_RG16F,			},
		{ "rg16i",				GL_RG16I,			},
		{ "rg16ui",				GL_RG16UI,			},
		{ "rg8",				GL_RG8,				},
		{ "rg8i",				GL_RG8I,			},
		{ "rg8ui",				GL_RG8UI,			},
		{ "rg8_snorm",			GL_RG8_SNORM,		},
		{ "r32f",				GL_R32F,			},
		{ "r32i",				GL_R32I,			},
		{ "r32ui",				GL_R32UI,			},
		{ "r16f",				GL_R16F,			},
		{ "r16i",				GL_R16I,			},
		{ "r16ui",				GL_R16UI,			},
		{ "r8",					GL_R8,				},
		{ "r8i",				GL_R8I,				},
		{ "r8ui",				GL_R8UI,			},
		{ "r8_snorm",			GL_R8_SNORM,		}
	};

	static const struct
	{
		const char*	name;
		deUint32	internalFormat;
	} depthStencilFormats[] =
	{
		// Depth and stencil formats
		{ "depth_component32f",	GL_DEPTH_COMPONENT32F	},
		{ "depth_component24",	GL_DEPTH_COMPONENT24	},
		{ "depth_component16",	GL_DEPTH_COMPONENT16	},
		{ "depth32f_stencil8",	GL_DEPTH32F_STENCIL8	},
		{ "depth24_stencil8",	GL_DEPTH24_STENCIL8		}
	};

	// Basic TexImage3D usage.
	{
		tcu::TestCaseGroup* basicTexImageGroup = new tcu::TestCaseGroup(m_testCtx, "basic_teximage3d", "Basic glTexImage3D() usage");
		addChild(basicTexImageGroup);
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(colorFormats); formatNdx++)
		{
			const char*	fmtName				= colorFormats[formatNdx].name;
			deUint32	format				= colorFormats[formatNdx].internalFormat;
			const int	texCubeArraySize	= 64;
			const int	texCubeArrayLayers	= 6;

			basicTexImageGroup->addChild(new BasicTexImageCubeArrayCase	(m_context,	(string(fmtName) + "_cube_array").c_str(),	"",	format, texCubeArraySize, texCubeArrayLayers));
		}
	}

	// glTexImage3D() pbo cases.
	{
		tcu::TestCaseGroup* pboGroup = new tcu::TestCaseGroup(m_testCtx, "teximage3d_pbo", "glTexImage3D() from PBO");
		addChild(pboGroup);

		// Parameter cases
		static const struct
		{
			const char*	name;
			deUint32	format;
			int			size;
			int			depth;
			int			imageHeight;
			int			rowLength;
			int			skipImages;
			int			skipRows;
			int			skipPixels;
			int			alignment;
			int			offset;
		} parameterCases[] =
		{
			{ "rgb8_offset",		GL_RGB8,	23,	6,	0,	0,	0,	0,	0,	1,	67 },
			{ "rgb8_alignment",		GL_RGB8,	23,	6,	0,	0,	0,	0,	0,	2,	0 },
			{ "rgb8_image_height",	GL_RGB8,	23,	6,	26,	0,	0,	0,	0,	4,	0 },
			{ "rgb8_row_length",	GL_RGB8,	23,	6,	0,	27,	0,	0,	0,	4,	0 },
			{ "rgb8_skip_images",	GL_RGB8,	23,	6,	0,	0,	3,	0,	0,	4,	0 },
			{ "rgb8_skip_rows",		GL_RGB8,	23,	6,	26,	0,	0,	3,	0,	4,	0 },
			{ "rgb8_skip_pixels",	GL_RGB8,	23,	6,	0,	25,	0,	0,	2,	4,	0 }
		};

		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(colorFormats); formatNdx++)
		{
			const string	fmtName				= colorFormats[formatNdx].name;
			const deUint32	format				= colorFormats[formatNdx].internalFormat;
			const int		texCubeArraySize	= 20;
			const int		texCubeDepth		= 6;

			pboGroup->addChild(new TexImageCubeArrayBufferCase	(m_context, (fmtName + "_cube_array").c_str(),	"", format, texCubeArraySize, texCubeDepth, 0, 0, 0, 0, 0, 4, 0));
		}

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(parameterCases); ndx++)
		{
			pboGroup->addChild(new TexImageCubeArrayBufferCase(m_context, (string(parameterCases[ndx].name) + "_cube_array").c_str(), "",
														parameterCases[ndx].format,
														parameterCases[ndx].size,
														parameterCases[ndx].depth,
														parameterCases[ndx].imageHeight,
														parameterCases[ndx].rowLength,
														parameterCases[ndx].skipImages,
														parameterCases[ndx].skipRows,
														parameterCases[ndx].skipPixels,
														parameterCases[ndx].alignment,
														parameterCases[ndx].offset));
		}
	}

	// glTexImage3D() depth cases.
	{
		tcu::TestCaseGroup* shadow3dGroup = new tcu::TestCaseGroup(m_testCtx, "teximage3d_depth", "glTexImage3D() with depth or depth/stencil format");
		addChild(shadow3dGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthStencilFormats); ndx++)
		{
			const int	texCubeArraySize	= 64;
			const int	texCubeArrayDepth	= 6;

			shadow3dGroup->addChild(new TexImageCubeArrayDepthCase(m_context, (std::string(depthStencilFormats[ndx].name) + "_cube_array").c_str(), "", depthStencilFormats[ndx].internalFormat, texCubeArraySize, texCubeArrayDepth));
		}
	}

	// glTexImage3D() depth cases with pbo.
	{
		tcu::TestCaseGroup* shadow3dGroup = new tcu::TestCaseGroup(m_testCtx, "teximage3d_depth_pbo", "glTexImage3D() with depth or depth/stencil format with pbo");
		addChild(shadow3dGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthStencilFormats); ndx++)
		{
			const int	texCubeArraySize	= 64;
			const int	texCubeArrayDepth	= 6;

			shadow3dGroup->addChild(new TexImageCubeArrayDepthBufferCase(m_context, (std::string(depthStencilFormats[ndx].name) + "_cube_array").c_str(), "", depthStencilFormats[ndx].internalFormat, texCubeArraySize, texCubeArrayDepth));
		}
	}

	// glTexSubImage3D() PBO cases.
	{
		tcu::TestCaseGroup* pboGroup = new tcu::TestCaseGroup(m_testCtx, "texsubimage3d_pbo", "glTexSubImage3D() pixel buffer object tests");
		addChild(pboGroup);

		static const struct
		{
			const char*	name;
			deUint32	format;
			int			size;
			int			depth;
			int			subX;
			int			subY;
			int			subZ;
			int			subW;
			int			subH;
			int			subD;
			int			imageHeight;
			int			rowLength;
			int			skipImages;
			int			skipRows;
			int			skipPixels;
			int			alignment;
			int			offset;
		} paramCases[] =
		{
			{ "rgb8_offset",		GL_RGB8,	26, 12,	1,	2,	1,	23,	19,	8,	0,	0,	0,	0,	0,	4,	67 },
			{ "rgb8_image_height",	GL_RGB8,	26, 12,	1,	2,	1,	23,	19,	8,	26,	0,	0,	0,	0,	4,	0 },
			{ "rgb8_row_length",	GL_RGB8,	26, 12,	1,	2,	1,	23,	19,	8,	0,	27,	0,	0,	0,	4,	0 },
			{ "rgb8_skip_images",	GL_RGB8,	26, 12,	1,	2,	1,	23,	19,	8,	0,	0,	3,	0,	0,	4,	0 },
			{ "rgb8_skip_rows",		GL_RGB8,	26, 12,	1,	2,	1,	23,	19,	8,	22,	0,	0,	3,	0,	4,	0 },
			{ "rgb8_skip_pixels",	GL_RGB8,	26, 12,	1,	2,	1,	23,	19,	8,	0,	25,	0,	0,	2,	4,	0 }
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(colorFormats); ndx++)
		{
			pboGroup->addChild(new TexSubImageCubeArrayBufferCase(m_context, (std::string(colorFormats[ndx].name) + "_cube_array").c_str(), "",
														   colorFormats[ndx].internalFormat,
														   26,	// Size
														   12,	// Depth
														   1,	// Sub X
														   2,	// Sub Y
														   0,	// Sub Z
														   23,	// Sub W
														   19,	// Sub H
														   8,	// Sub D
														   0,	// Image height
														   0,	// Row length
														   0,	// Skip images
														   0,	// Skip rows
														   0,	// Skip pixels
														   4,	// Alignment
														   0	/* offset */));
		}

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(paramCases); ndx++)
		{
			pboGroup->addChild(new TexSubImageCubeArrayBufferCase(m_context, (std::string(paramCases[ndx].name) + "_cube_array").c_str(), "",
														   paramCases[ndx].format,
														   paramCases[ndx].size,
														   paramCases[ndx].depth,
														   paramCases[ndx].subX,
														   paramCases[ndx].subY,
														   paramCases[ndx].subZ,
														   paramCases[ndx].subW,
														   paramCases[ndx].subH,
														   paramCases[ndx].subD,
														   paramCases[ndx].imageHeight,
														   paramCases[ndx].rowLength,
														   paramCases[ndx].skipImages,
														   paramCases[ndx].skipRows,
														   paramCases[ndx].skipPixels,
														   paramCases[ndx].alignment,
														   paramCases[ndx].offset));
		}
	}

	// glTexSubImage3D() depth cases.
	{
		tcu::TestCaseGroup* shadow3dGroup = new tcu::TestCaseGroup(m_testCtx, "texsubimage3d_depth", "glTexSubImage3D() with depth or depth/stencil format");
		addChild(shadow3dGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthStencilFormats); ndx++)
		{
			const int	texCubeArraySize	= 57;
			const int	texCubeArrayLayers	= 6;

			shadow3dGroup->addChild(new TexSubImageCubeArrayDepthCase(m_context, (std::string(depthStencilFormats[ndx].name) + "_cube_array").c_str(), "", depthStencilFormats[ndx].internalFormat, texCubeArraySize, texCubeArrayLayers));
		}
	}

	// glTexStorage3D() cases.
	{
		tcu::TestCaseGroup* texStorageGroup = new tcu::TestCaseGroup(m_testCtx, "texstorage3d", "Basic glTexStorage3D() usage");
		addChild(texStorageGroup);

		// All formats.
		tcu::TestCaseGroup* formatGroup = new tcu::TestCaseGroup(m_testCtx, "format", "glTexStorage3D() with all formats");
		texStorageGroup->addChild(formatGroup);

		// Color formats.
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(colorFormats); formatNdx++)
		{
			const char*	fmtName				= colorFormats[formatNdx].name;
			deUint32	internalFormat		= colorFormats[formatNdx].internalFormat;
			const int	texCubeArraySize	= 57;
			const int	texCubeArrayLayers	= 6;
			int			texCubeArrayLevels	= maxLevelCount(texCubeArraySize);

			formatGroup->addChild(new BasicTexStorageCubeArrayCase	(m_context, (string(fmtName) + "_cube_array").c_str(),	"", internalFormat, texCubeArraySize, texCubeArrayLayers, texCubeArrayLevels));
		}

		// Depth/stencil formats (only 2D texture array is supported).
		for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(depthStencilFormats); formatNdx++)
		{
			const char*	fmtName				= depthStencilFormats[formatNdx].name;
			deUint32	internalFormat		= depthStencilFormats[formatNdx].internalFormat;
			const int	texCubeArraySize	= 57;
			const int	texCubeArrayLayers	= 6;
			int			texCubeArrayLevels	= maxLevelCount(texCubeArraySize);

			formatGroup->addChild(new BasicTexStorageCubeArrayCase	(m_context, (string(fmtName) + "_cube_array").c_str(),	"", internalFormat, texCubeArraySize, texCubeArrayLayers, texCubeArrayLevels));
		}

		// Sizes.
		static const struct
		{
			int				size;
			int				layers;
			int				levels;
		} texCubeArraySizes[] =
		{
			//	Sz	La	Le
			{	1,	6,	1 },
			{	2,	6,	2 },
			{	32,	6,	3 },
			{	64,	6,	4 },
			{	57,	12,	1 },
			{	57,	12,	2 },
			{	57,	12,	6 }
		};

		tcu::TestCaseGroup* sizeGroup = new tcu::TestCaseGroup(m_testCtx, "size", "glTexStorage3D() with various sizes");
		texStorageGroup->addChild(sizeGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(texCubeArraySizes); ndx++)
		{
			const deUint32		format		= GL_RGBA8;
			int					size		= texCubeArraySizes[ndx].size;
			int					layers		= texCubeArraySizes[ndx].layers;
			int					levels		= texCubeArraySizes[ndx].levels;
			string				name		= string("cube_array_") + de::toString(size) + "x" + de::toString(size) + "x" + de::toString(layers) + "_" + de::toString(levels) + "_levels";

			sizeGroup->addChild(new BasicTexStorageCubeArrayCase(m_context, name.c_str(), "", format, size, layers, levels));
		}
	}
}